

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::getHeapTypeFromIdx
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *this,Index idx)

{
  size_type sVar1;
  const_reference u;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  uint local_1c;
  ParseModuleTypesCtx *pPStack_18;
  Index idx_local;
  ParseModuleTypesCtx *this_local;
  
  local_1c = idx;
  pPStack_18 = this;
  this_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  sVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(this->types);
  if (idx < sVar1) {
    u = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                  (this->types,(ulong)local_1c);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
    Result<wasm::HeapType_const&>(__return_storage_ptr__,u);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"type index out of bounds",&local_61);
    Lexer::err(&local_40,&this->in,&local_60);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::Result
              (__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<HeapTypeT> getHeapTypeFromIdx(Index idx) {
    if (idx >= types.size()) {
      return in.err("type index out of bounds");
    }
    return types[idx];
  }